

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

bool compress_file(ilzham *lzham_dll,char *pSrc_filename,char *pDst_filename,comp_options *options,
                  char *pSeed_filename,float *pTotal_comp_time)

{
  bool bVar1;
  uint uVar2;
  timer_ticks tVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  undefined4 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  long in_R8;
  float *in_R9;
  float fVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint64 cmp_file_size;
  double total_time;
  timer_ticks end_time;
  timer_ticks total_deinit_time;
  uint32 adler32;
  timer_ticks deinit_start_time;
  uint64 cmp_file_size_1;
  int i_2;
  timer_ticks comp_time;
  timer_ticks comp_start_time;
  size_t out_num_bytes;
  uint8 *pOut_bytes;
  size_t num_in_bytes;
  uint8 *pIn_bytes;
  int i_1;
  double comp_rate;
  double total_bytes_processed;
  double total_elapsed_time;
  uint pass;
  uint total_passes;
  lzham_compress_status_t status;
  float total_comp_time;
  timer_ticks total_init_time;
  lzham_compress_state_ptr pComp_state;
  timer_ticks init_start_time;
  lzham_compress_params params;
  timer_ticks start_time;
  uint64 total_output_bytes;
  uint in_file_buf_ofs;
  uint in_file_buf_size;
  uint64 src_bytes_left;
  uint8 *out_file_buf;
  uint8 *in_file_buf;
  uint cOutBufSize;
  uint cInBufSize;
  uint64 cmp_file_header_size;
  uint i;
  uint64 src_file_size;
  FILE *pOutFile;
  FILE *pInFile;
  float local_220;
  uint in_stack_fffffffffffffde4;
  void **in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  float local_1fc;
  float local_1f4;
  float local_1d8;
  float local_1cc;
  float local_1c4;
  ulong local_1b0;
  float local_19c;
  float local_194;
  double local_190;
  int local_14c;
  ulong local_138;
  void *local_130;
  ulong local_128;
  long local_120;
  int local_114;
  double local_110;
  double local_108;
  double local_100;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  float local_ec;
  long local_e8;
  long local_e0;
  timer_ticks local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  uint local_bc;
  void *local_b0;
  undefined4 local_a0;
  undefined4 local_9c;
  timer_ticks local_98;
  long local_90;
  uint local_88;
  uint local_84;
  ulong local_80;
  void *local_78;
  void *local_70;
  undefined4 local_68;
  undefined4 local_64;
  __off64_t local_60;
  uint local_54;
  ulong local_50;
  FILE *local_48;
  FILE *local_40;
  float *local_38;
  long local_30;
  undefined4 *local_28;
  char *local_20;
  char *local_18;
  long local_10;
  bool local_1;
  
  if (in_R9 != (float *)0x0) {
    *in_R9 = 0.0;
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  printf("Testing: Streaming compression\n");
  local_40 = fopen64(local_18,"rb");
  if (local_40 == (FILE *)0x0) {
    print_error("Unable to read file: %s\n",local_18);
    local_1 = false;
  }
  else {
    local_48 = fopen64(local_20,"wb");
    if (local_48 == (FILE *)0x0) {
      print_error("Unable to create file: %s\n",local_20);
      local_1 = false;
    }
    else {
      fseeko64(local_40,0,2);
      local_50 = ftello64(local_40);
      fseeko64(local_40,0,0);
      fputc(0x4c,local_48);
      fputc(0x5a,local_48);
      fputc(0x48,local_48);
      fputc(0x30,local_48);
      fputc(local_28[1],local_48);
      for (local_54 = 0; local_54 < 8; local_54 = local_54 + 1) {
        fputc((uint)(local_50 >> ((byte)(local_54 << 3) & 0x3f)) & 0xff,local_48);
      }
      local_60 = ftello64(local_48);
      local_64 = 0x40000;
      local_68 = 0x40000;
      local_70 = (void *)memalign(0x10,0x40000);
      local_78 = (void *)memalign(0x10);
      if ((local_70 == (void *)0x0) || (local_78 == (void *)0x0)) {
        print_error("Out of memory!\n");
        free(local_70);
        free(local_78);
        fclose(local_40);
        fclose(local_48);
        local_1 = false;
      }
      else {
        local_80 = local_50;
        local_84 = 0;
        local_88 = 0;
        local_90 = 0;
        local_98 = timer::get_ticks();
        memset(&local_d0,0,0x38);
        local_d0 = 0x38;
        local_cc = local_28[1];
        local_c0 = local_28[3];
        local_c8 = *local_28;
        if ((*(byte *)((long)local_28 + 0x13) & 1) != 0) {
          local_bc = local_bc | 2;
        }
        if ((*(byte *)(local_28 + 5) & 1) != 0) {
          local_bc = local_bc | 4;
        }
        if ((*(byte *)((long)local_28 + 0x15) & 1) != 0) {
          local_bc = local_bc | 0x10;
        }
        if ((*(byte *)(local_28 + 8) & 1) != 0) {
          local_bc = local_bc | 0x40;
        }
        if ((*(byte *)((long)local_28 + 0x21) & 1) != 0) {
          local_bc = local_bc | 0x80;
        }
        local_9c = local_28[9];
        local_c4 = local_28[6];
        local_a0 = local_28[7];
        if ((local_30 == 0) ||
           (bVar1 = read_seed_file((char *)CONCAT44(in_stack_fffffffffffffdfc,
                                                    in_stack_fffffffffffffdf8),
                                   (lzham_uint32 *)
                                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                   in_stack_fffffffffffffde8,in_stack_fffffffffffffde4), bVar1)) {
          local_d8 = timer::get_ticks();
          local_e0 = (**(code **)(local_10 + 0x18))(&local_d0);
          tVar3 = timer::get_ticks();
          local_e8 = tVar3 - local_d8;
          dVar8 = timer::ticks_to_secs(0x10b491);
          local_ec = (float)dVar8;
          if ((local_e0 != 0) &&
             (((*(byte *)((long)local_28 + 0x16) & 1) != 0 &&
              (lVar4 = (**(code **)(local_10 + 0x20))(local_e0), lVar4 == 0)))) {
            (**(code **)(local_10 + 0x28))(local_e0);
            local_e0 = 0;
          }
          if (local_e0 == 0) {
            print_error("Failed initializing compressor!\n");
            free(local_70);
            free(local_78);
            fclose(local_40);
            fclose(local_48);
            free(local_b0);
            local_1 = false;
          }
          else {
            dVar8 = timer::ticks_to_secs(0x10b56b);
            printf("lzham_compress_init took %3.3fms\n",dVar8 * 1000.0);
            local_f0 = 4;
            local_f4 = 1;
            if ((*(byte *)((long)local_28 + 0x16) & 1) != 0) {
              local_f4 = 2;
            }
            for (local_f8 = 0; local_f8 < local_f4; local_f8 = local_f8 + 1) {
              do {
                if (local_50 != 0) {
                  timer::get_ticks();
                  local_100 = timer::ticks_to_secs(0x10b5fa);
                  lVar4 = local_50 - local_80;
                  auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
                  auVar9._0_8_ = lVar4;
                  auVar9._12_4_ = 0x45300000;
                  local_108 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
                  if (local_100 <= 0.0) {
                    local_190 = 0.0;
                  }
                  else {
                    local_190 = local_108 / local_100;
                  }
                  local_110 = local_190;
                  for (local_114 = 0; local_114 < 0xf; local_114 = local_114 + 1) {
                    printf("\b\b\b\b");
                  }
                  local_194 = (float)local_80;
                  local_19c = (float)local_50;
                  printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec",
                         (double)((1.0 - local_194 / local_19c) * 100.0),
                         (double)(local_194 / 1048576.0),local_110 / 1048576.0);
                  printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
                }
                if (local_88 == local_84) {
                  if (local_80 < 0x40001) {
                    local_1b0 = local_80;
                  }
                  else {
                    local_1b0 = 0x40000;
                  }
                  local_84 = (uint)local_1b0;
                  sVar5 = fread(local_70,1,local_1b0 & 0xffffffff,local_40);
                  if (sVar5 != local_84) {
                    printf("\n");
                    print_error("Failure reading from source file!\n");
                    free(local_70);
                    free(local_78);
                    fclose(local_40);
                    fclose(local_48);
                    free(local_b0);
                    (**(code **)(local_10 + 0x28))(local_e0);
                    return false;
                  }
                  local_80 = local_80 - local_84;
                  local_88 = 0;
                }
                local_120 = (long)local_70 + (ulong)local_88;
                local_128 = (ulong)(local_84 - local_88);
                local_130 = local_78;
                local_138 = 0x40000;
                timer::get_ticks();
                local_f0 = (**(code **)(local_10 + 0x30))
                                     (local_e0,local_120,&local_128,local_130,&local_138,
                                      local_80 == 0);
                timer::get_ticks();
                dVar8 = timer::ticks_to_secs(0x10b9e5);
                local_ec = (float)dVar8 + local_ec;
                if (local_128 != 0) {
                  local_88 = (int)local_128 + local_88;
                }
                if (local_138 != 0) {
                  sVar5 = fwrite(local_78,1,local_138 & 0xffffffff,local_48);
                  if (sVar5 != local_138) {
                    printf("\n");
                    print_error("Failure writing to destination file!\n");
                    free(local_70);
                    free(local_78);
                    fclose(local_40);
                    fclose(local_48);
                    free(local_b0);
                    (**(code **)(local_10 + 0x28))(local_e0);
                    return false;
                  }
                  local_90 = local_138 + local_90;
                }
              } while (local_f0 < 3);
              for (local_14c = 0; local_14c < 0xf; local_14c = local_14c + 1) {
                printf("\b\b\b\b    \b\b\b\b");
              }
              if ((local_f8 == 0) && (local_f4 == 2)) {
                printf("\n");
                uVar6 = ftello64(local_48);
                if (local_50 == 0) {
                  local_1d8 = 0.0;
                }
                else {
                  local_1c4 = (float)uVar6;
                  local_1cc = (float)local_50;
                  local_1d8 = (1.0 - local_1c4 / local_1cc) * 100.0;
                }
                printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",
                       (double)local_1d8,local_50,uVar6);
                local_d8 = timer::get_ticks();
                lVar4 = (**(code **)(local_10 + 0x20))(local_e0);
                if (lVar4 == 0) {
                  print_error("Failed reinitializing compressor!\n");
                  free(local_70);
                  free(local_78);
                  fclose(local_40);
                  fclose(local_48);
                  free(local_b0);
                  (**(code **)(local_10 + 0x28))(local_e0);
                  return false;
                }
                tVar3 = timer::get_ticks();
                local_e8 = tVar3 - local_d8;
                dVar8 = timer::ticks_to_secs(0x10bd54);
                printf("lzham_compress_reinit took %3.3fms\n",dVar8 * 1000.0);
                fseek(local_40,0,0);
                fseek(local_48,local_60,0);
                local_80 = local_50;
                local_84 = 0;
                local_88 = 0;
                local_90 = 0;
              }
            }
            local_80 = (local_84 - local_88) + local_80;
            timer::get_ticks();
            uVar2 = (**(code **)(local_10 + 0x28))(local_e0);
            timer::get_ticks();
            dVar8 = timer::ticks_to_secs(0x10be4e);
            local_ec = (float)dVar8 + local_ec;
            if (local_38 != (float *)0x0) {
              *local_38 = local_ec;
            }
            local_e0 = 0;
            timer::get_ticks();
            dVar8 = timer::ticks_to_secs(0x10bee2);
            uVar6 = ftello64(local_48);
            free(local_70);
            local_70 = (void *)0x0;
            free(local_78);
            local_78 = (void *)0x0;
            free(local_b0);
            local_b0 = (void *)0x0;
            fclose(local_40);
            local_40 = (FILE *)0x0;
            fclose(local_48);
            local_48 = (FILE *)0x0;
            if (local_f0 == 3) {
              if (local_80 == 0) {
                printf("Success\n");
                if (local_50 == 0) {
                  fVar7 = 0.0;
                }
                else {
                  local_1f4 = (float)uVar6;
                  local_1fc = (float)local_50;
                  fVar7 = (1.0 - local_1f4 / local_1fc) * 100.0;
                }
                printf("Input file size: %llu, Compressed file size: %llu, Ratio: %3.2f%%\n",
                       (double)fVar7,local_50,uVar6);
                local_220 = (float)uVar6;
                printf("Compression-only time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n"
                       ,(double)local_ec,(double)((float)local_50 / local_ec),
                       (double)(local_220 / local_ec));
                auVar10._8_4_ = (int)(local_50 >> 0x20);
                auVar10._0_8_ = local_50;
                auVar10._12_4_ = 0x45300000;
                auVar11._8_4_ = (int)(uVar6 >> 0x20);
                auVar11._0_8_ = uVar6;
                auVar11._12_4_ = 0x45300000;
                printf("Total time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n"
                       ,dVar8,((auVar10._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0)) /
                              dVar8,
                       ((auVar11._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) / dVar8);
                printf("Input file adler32: 0x%08X\n",(ulong)uVar2);
                local_1 = true;
              }
              else {
                print_error("Compressor failed to consume entire input file!\n");
                local_1 = false;
              }
            }
            else {
              print_error("Compression failed with status %i\n",(ulong)local_f0);
              local_1 = false;
            }
          }
        }
        else {
          free(local_70);
          free(local_78);
          fclose(local_40);
          fclose(local_48);
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

static bool compress_file(ilzham &lzham_dll, const char* pSrc_filename, const char *pDst_filename, const comp_options &options, const char *pSeed_filename, float *pTotal_comp_time = NULL)
{
	if (pTotal_comp_time)
		*pTotal_comp_time = 0;

   printf("Testing: Streaming compression\n");

   FILE *pInFile = fopen(pSrc_filename, "rb");
   if (!pInFile)
   {
      print_error("Unable to read file: %s\n", pSrc_filename);
      return false;
   }

   FILE *pOutFile = fopen(pDst_filename, "wb");
   if (!pOutFile)
   {
      print_error("Unable to create file: %s\n", pDst_filename);
      return false;
   }

   _fseeki64(pInFile, 0, SEEK_END);
   uint64 src_file_size = _ftelli64(pInFile);
   _fseeki64(pInFile, 0, SEEK_SET);

   fputc('L', pOutFile);
   fputc('Z', pOutFile);
   fputc('H', pOutFile);
   fputc('0', pOutFile);
   fputc(options.m_dict_size_log2, pOutFile);

   for (uint i = 0; i < 8; i++)
   {
      fputc(static_cast<int>((src_file_size >> (i * 8)) & 0xFF), pOutFile);
   }

   uint64 cmp_file_header_size = _ftelli64(pOutFile);

   const uint cInBufSize = LZHAMTEST_COMP_INPUT_BUFFER_SIZE;
   const uint cOutBufSize = LZHAMTEST_COMP_OUTPUT_BUFFER_SIZE;

   uint8 *in_file_buf = static_cast<uint8*>(_aligned_malloc(cInBufSize, 16));
   uint8 *out_file_buf = static_cast<uint8*>(_aligned_malloc(cOutBufSize, 16));
   if ((!in_file_buf) || (!out_file_buf))
   {
      print_error("Out of memory!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      return false;
   }

   uint64 src_bytes_left = src_file_size;

   uint in_file_buf_size = 0;
   uint in_file_buf_ofs = 0;

   uint64 total_output_bytes = 0;

   timer_ticks start_time = timer::get_ticks();

   lzham_compress_params params;
   memset(&params, 0, sizeof(params));
   params.m_struct_size = sizeof(lzham_compress_params);
   params.m_dict_size_log2 = options.m_dict_size_log2;
   params.m_max_helper_threads = options.m_max_helper_threads;
   params.m_level = options.m_comp_level;
   if (options.m_extreme_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_EXTREME_PARSING;
   if (options.m_deterministic_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_DETERMINISTIC_PARSING;
   if (options.m_tradeoff_decomp_rate_for_comp_ratio)
      params.m_compress_flags |= LZHAM_COMP_FLAG_TRADEOFF_DECOMPRESSION_RATE_FOR_COMP_RATIO;
   if (options.m_force_single_threaded_parsing)
      params.m_compress_flags |= LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING;
   if (options.m_low_memory_finder)
      params.m_compress_flags |= LZHAM_COMP_FLAG_USE_LOW_MEMORY_MATCH_FINDER;
   params.m_fast_bytes = options.m_fast_bytes;

   params.m_table_update_rate = options.m_table_update_rate;
   params.m_extreme_parsing_max_best_arrivals  = options.m_max_best_arrivals;

   if (pSeed_filename)
   {
      if (!read_seed_file(pSeed_filename, params.m_num_seed_bytes, params.m_pSeed_bytes, params.m_dict_size_log2))
      {
         _aligned_free(in_file_buf);
         _aligned_free(out_file_buf);
         fclose(pInFile);
         fclose(pOutFile);
         return false;
      }
   }

   timer_ticks init_start_time = timer::get_ticks();
   lzham_compress_state_ptr pComp_state = lzham_dll.lzham_compress_init(&params);
   timer_ticks total_init_time = timer::get_ticks() - init_start_time;

	float total_comp_time = (float)timer::ticks_to_secs(total_init_time);

   if ((pComp_state) && (options.m_test_compressor_reinit))
   {
      if (!lzham_dll.lzham_compress_reinit(pComp_state))
      {
         lzham_dll.lzham_compress_deinit(pComp_state);
         pComp_state = NULL;
      }
   }

   if (!pComp_state)
   {
      print_error("Failed initializing compressor!\n");
      _aligned_free(in_file_buf);
      _aligned_free(out_file_buf);
      fclose(pInFile);
      fclose(pOutFile);
      _aligned_free((void*)params.m_pSeed_bytes);
      return false;
   }

   printf("lzham_compress_init took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

   lzham_compress_status_t status = LZHAM_COMP_STATUS_FAILED;

   // Performs 1 pass normally, or 2 passes to test compressor reinitialization (with a reinit in between the passes).
   uint total_passes = options.m_test_compressor_reinit ? 2 : 1;
   for (uint pass = 0; pass < total_passes; ++pass)
   {
      for ( ; ; )
      {
         if (src_file_size)
         {
            double total_elapsed_time = timer::ticks_to_secs(timer::get_ticks() - start_time);
            double total_bytes_processed = static_cast<double>(src_file_size - src_bytes_left);
            double comp_rate = (total_elapsed_time > 0.0f) ? total_bytes_processed / total_elapsed_time : 0.0f;

   #ifdef LZHAM_PRINT_OUTPUT_PROGRESS
            for (int i = 0; i < 15; i++)
               printf("\b\b\b\b");
            printf("Progress: %3.1f%%, Bytes Remaining: %3.1fMB, %3.3fMB/sec", (1.0f - (static_cast<float>(src_bytes_left) / src_file_size)) * 100.0f, src_bytes_left / 1048576.0f, comp_rate / (1024.0f * 1024.0f));
            printf("                \b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b");
   #endif
         }

         if (in_file_buf_ofs == in_file_buf_size)
         {
            in_file_buf_size = static_cast<uint>(my_min(cInBufSize, src_bytes_left));

            if (fread(in_file_buf, 1, in_file_buf_size, pInFile) != in_file_buf_size)
            {
               printf("\n");
               print_error("Failure reading from source file!\n");
               _aligned_free(in_file_buf);
               _aligned_free(out_file_buf);
               fclose(pInFile);
               fclose(pOutFile);
               _aligned_free((void*)params.m_pSeed_bytes);
               lzham_dll.lzham_compress_deinit(pComp_state);
               return false;
            }

            src_bytes_left -= in_file_buf_size;

            in_file_buf_ofs = 0;
         }

         uint8 *pIn_bytes = &in_file_buf[in_file_buf_ofs];
         size_t num_in_bytes = in_file_buf_size - in_file_buf_ofs;
         uint8* pOut_bytes = out_file_buf;
         size_t out_num_bytes = cOutBufSize;

			timer_ticks comp_start_time = timer::get_ticks();
         status = lzham_dll.lzham_compress(pComp_state, pIn_bytes, &num_in_bytes, pOut_bytes, &out_num_bytes, src_bytes_left == 0);
			timer_ticks comp_time = timer::get_ticks() - comp_start_time;

			total_comp_time += (float)timer::ticks_to_secs(comp_time);

         if (num_in_bytes)
         {
            in_file_buf_ofs += (uint)num_in_bytes;
            assert(in_file_buf_ofs <= in_file_buf_size);
         }

         if (out_num_bytes)
         {
            if (fwrite(out_file_buf, 1, static_cast<uint>(out_num_bytes), pOutFile) != out_num_bytes)
            {
               printf("\n");
               print_error("Failure writing to destination file!\n");
               _aligned_free(in_file_buf);
               _aligned_free(out_file_buf);
               fclose(pInFile);
               fclose(pOutFile);
               _aligned_free((void*)params.m_pSeed_bytes);
               lzham_dll.lzham_compress_deinit(pComp_state);
               return false;
            }

            total_output_bytes += out_num_bytes;
         }

         if (status >= LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE)
            break;
      }

#ifdef LZHAM_PRINT_OUTPUT_PROGRESS
      for (int i = 0; i < 15; i++)
      {
         printf("\b\b\b\b    \b\b\b\b");
      }
#endif

      if ((pass == 0) && (total_passes == 2))
      {
         printf("\n");

         uint64 cmp_file_size = _ftelli64(pOutFile);
         printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);

         init_start_time = timer::get_ticks();
         if (!lzham_dll.lzham_compress_reinit(pComp_state))
         {
            print_error("Failed reinitializing compressor!\n");
            _aligned_free(in_file_buf);
            _aligned_free(out_file_buf);
            fclose(pInFile);
            fclose(pOutFile);
            _aligned_free((void*)params.m_pSeed_bytes);
            lzham_dll.lzham_compress_deinit(pComp_state);
            return false;
         }
         total_init_time = timer::get_ticks() - init_start_time;
         printf("lzham_compress_reinit took %3.3fms\n", timer::ticks_to_secs(total_init_time)*1000.0f);

         fseek(pInFile, 0, SEEK_SET);
         fseek(pOutFile, static_cast<long>(cmp_file_header_size), SEEK_SET);

         src_bytes_left = src_file_size;
         in_file_buf_size = 0;
         in_file_buf_ofs = 0;
         total_output_bytes = 0;
      }
   }

   src_bytes_left += (in_file_buf_size - in_file_buf_ofs);

	timer_ticks deinit_start_time = timer::get_ticks();
   uint32 adler32 = lzham_dll.lzham_compress_deinit(pComp_state);
	timer_ticks total_deinit_time = timer::get_ticks() - deinit_start_time;

	total_comp_time += (float)timer::ticks_to_secs(total_deinit_time);
	if (pTotal_comp_time)
		*pTotal_comp_time = total_comp_time;

   pComp_state = NULL;

   timer_ticks end_time = timer::get_ticks();
   double total_time = timer::ticks_to_secs(my_max(1, end_time - start_time));

   uint64 cmp_file_size = _ftelli64(pOutFile);

   _aligned_free(in_file_buf);
   in_file_buf = NULL;
   _aligned_free(out_file_buf);
   out_file_buf = NULL;
   _aligned_free((void*)params.m_pSeed_bytes);
   params.m_pSeed_bytes = NULL;

   fclose(pInFile);
   pInFile = NULL;
   fclose(pOutFile);
   pOutFile = NULL;

   if (status != LZHAM_COMP_STATUS_SUCCESS)
   {
      print_error("Compression failed with status %i\n", status);
      return false;
   }

   if (src_bytes_left)
   {
      print_error("Compressor failed to consume entire input file!\n");
      return false;
   }

   printf("Success\n");
   printf("Input file size: " QUAD_INT_FMT ", Compressed file size: " QUAD_INT_FMT ", Ratio: %3.2f%%\n", src_file_size, cmp_file_size, src_file_size ? ((1.0f - (static_cast<float>(cmp_file_size) / src_file_size)) * 100.0f) : 0.0f);
	printf("Compression-only time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_comp_time, src_file_size / total_comp_time, cmp_file_size / total_comp_time);
   printf("Total time: %3.6f\nConsumption rate: %9.1f bytes/sec, Emission rate: %9.1f bytes/sec\n", total_time, src_file_size / total_time, cmp_file_size / total_time);
   printf("Input file adler32: 0x%08X\n", adler32);

   return true;
}